

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool consume_pragma(Env *env)

{
  _Bool _Var1;
  _Bool local_19;
  Env *env_local;
  
  _Var1 = seq(env,"{-#");
  if (_Var1) {
    while( true ) {
      _Var1 = seq(env,"#-}");
      local_19 = false;
      if (!_Var1) {
        local_19 = not_eof(env);
      }
      if (local_19 == false) break;
      reset_lookahead(env);
      advance_over(env,0);
    }
    env_local._7_1_ = true;
  }
  else {
    env_local._7_1_ = false;
  }
  return env_local._7_1_;
}

Assistant:

static bool consume_pragma(Env *env) {
  if (seq(env, "{-#")) {
    while (!seq(env, "#-}") && not_eof(env)) {
      reset_lookahead(env);
      advance_over(env, 0);
    }
    return true;
  }
  return false;
}